

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_status_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::SubscriptonStatusTest_test_to_string_Test::TestBody
          (SubscriptonStatusTest_test_to_string_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ss_.ptr_._0_4_ = 6;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_18,"\"UNAVAILABLE\"","subscription_status_map[SubscriptionStatus::UNAVAILABLE]",
             (char (*) [12])"UNAVAILABLE",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 0xb;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_18,"\"CLOSED\"","subscription_status_map[SubscriptionStatus::CLOSED]",
             (char (*) [7])"CLOSED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 3;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            (local_18,"\"CANCELLED\"","subscription_status_map[SubscriptionStatus::CANCELLED]",
             (char (*) [10])"CANCELLED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 4;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_18,"\"DISCONTINUED\"","subscription_status_map[SubscriptionStatus::DISCONTINUED]"
             ,(char (*) [13])"DISCONTINUED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 10;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            (local_18,"\"EXHAUSTED\"","subscription_status_map[SubscriptionStatus::EXHAUSTED]",
             (char (*) [10])"EXHAUSTED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 9;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_18,"\"INACTIVE\"","subscription_status_map[SubscriptionStatus::INACTIVE]",
             (char (*) [9])"INACTIVE",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 1;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_18,"\"OK\"","subscription_status_map[SubscriptionStatus::OK]",
             (char (*) [3])0x21cd44,pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 0;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_18,"\"PENDING\"","subscription_status_map[SubscriptionStatus::PENDING]",
             (char (*) [8])"PENDING",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 5;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_18,"\"PROHIBITED\"","subscription_status_map[SubscriptionStatus::PROHIBITED]",
             (char (*) [11])"PROHIBITED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 7;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_18,"\"REJECTED\"","subscription_status_map[SubscriptionStatus::REJECTED]",
             (char (*) [9])"REJECTED",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 2;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_18,"\"STALE\"","subscription_status_map[SubscriptionStatus::STALE]",
             (char (*) [6])"STALE",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_4_ = 8;
  pmVar2 = std::
           map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::SubscriptionStatus>,_std::allocator<std::pair<const_bidfx_public_api::SubscriptionStatus,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)subscription_status_map_abi_cxx11_,(key_type *)&local_28);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_18,"\"TIMEOUT\"","subscription_status_map[SubscriptionStatus::TIMEOUT]",
             (char (*) [8])"TIMEOUT",pmVar2);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/subscription_status_test.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SubscriptonStatusTest, test_to_string)
{
    EXPECT_EQ("UNAVAILABLE", subscription_status_map[SubscriptionStatus::UNAVAILABLE]);
    EXPECT_EQ("CLOSED", subscription_status_map[SubscriptionStatus::CLOSED]);
    EXPECT_EQ("CANCELLED", subscription_status_map[SubscriptionStatus::CANCELLED]);
    EXPECT_EQ("DISCONTINUED", subscription_status_map[SubscriptionStatus::DISCONTINUED]);
    EXPECT_EQ("EXHAUSTED", subscription_status_map[SubscriptionStatus::EXHAUSTED]);
    EXPECT_EQ("INACTIVE", subscription_status_map[SubscriptionStatus::INACTIVE]);
    EXPECT_EQ("OK", subscription_status_map[SubscriptionStatus::OK]);
    EXPECT_EQ("PENDING", subscription_status_map[SubscriptionStatus::PENDING]);
    EXPECT_EQ("PROHIBITED", subscription_status_map[SubscriptionStatus::PROHIBITED]);
    EXPECT_EQ("REJECTED", subscription_status_map[SubscriptionStatus::REJECTED]);
    EXPECT_EQ("STALE", subscription_status_map[SubscriptionStatus::STALE]);
    EXPECT_EQ("TIMEOUT", subscription_status_map[SubscriptionStatus::TIMEOUT]);
}